

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim_rpc.hpp
# Opt level: O1

void __thiscall nvim::NvimRPC::async_call<long,long>(NvimRPC *this,string *method,long *u,long *u_1)

{
  ulong uVar1;
  uint16_t val;
  uint uVar2;
  long *__n;
  size_t __n_00;
  Packer pk;
  char d;
  sbuffer sbuf;
  packer<msgpack::v1::sbuffer> local_58;
  undefined1 local_49;
  ulong local_48;
  sbuffer local_40;
  
  __n = u_1;
  msgpack::v1::sbuffer::sbuffer(&local_40,0x2000);
  local_49 = 0x94;
  local_58.m_stream = &local_40;
  msgpack::v1::sbuffer::write(&local_40,(int)&local_49,(void *)0x1,(size_t)__n);
  local_49 = 0;
  msgpack::v1::sbuffer::write(local_58.m_stream,(int)&local_49,(void *)0x1,(size_t)__n);
  uVar1 = this->msgid_;
  __n_00 = uVar1 + 1;
  this->msgid_ = __n_00;
  if (uVar1 < 0x100) {
    if (uVar1 < 0x80) {
      local_49 = (char)uVar1;
      msgpack::v1::sbuffer::write(local_58.m_stream,(int)&local_49,(void *)0x1,__n_00);
    }
    else {
      local_49 = 0xcc;
      local_48 = CONCAT71(local_48._1_7_,(char)uVar1);
      msgpack::v1::sbuffer::write(local_58.m_stream,(int)&local_49,(void *)0x2,__n_00);
    }
  }
  else if (uVar1 < 0x10000) {
    local_49 = 0xcd;
    local_48 = CONCAT62(local_48._2_6_,(ushort)uVar1 << 8 | (ushort)uVar1 >> 8);
    msgpack::v1::sbuffer::write(local_58.m_stream,(int)&local_49,(void *)0x3,__n_00);
  }
  else {
    __n_00 = uVar1 >> 0x20;
    if (__n_00 == 0) {
      local_49 = 0xce;
      uVar2 = (uint)uVar1;
      local_48 = CONCAT44(local_48._4_4_,
                          uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                          uVar2 << 0x18);
      msgpack::v1::sbuffer::write(local_58.m_stream,(int)&local_49,(void *)0x5,0);
    }
    else {
      local_49 = 0xcf;
      local_48 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                 (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                 (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 |
                 uVar1 << 0x38;
      msgpack::v1::sbuffer::write(local_58.m_stream,(int)&local_49,(void *)0x9,__n_00);
    }
  }
  msgpack::v1::adaptor::pack<std::__cxx11::string,void>::operator()(&local_49,&local_58,method);
  local_49 = 0x92;
  msgpack::v1::sbuffer::write(local_58.m_stream,(int)&local_49,(void *)0x1,__n_00);
  msgpack::v1::packer<msgpack::v1::sbuffer>::pack_imp_int64<long>(&local_58,*u);
  msgpack::v1::packer<msgpack::v1::sbuffer>::pack_imp_int64<long>(&local_58,*u_1);
  Socket::write(&this->socket_,(int)local_40.m_data,(void *)local_40.m_size,__n_00);
  free(local_40.m_data);
  return;
}

Assistant:

void NvimRPC::async_call(const std::string &method, const U&...u) {
    msgpack::sbuffer sbuf;
    detail::Packer pk(&sbuf);
    pk.pack_array(4) << (uint64_t)REQUEST
                     << msgid_++
                     << method;

    pk.pack_array(sizeof...(u));
    detail::pack(pk, u...);

    socket_.write(sbuf.data(), sbuf.size(), 5);
}